

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O1

RealType __thiscall
OpenMD::InversePowerSeries::getSuggestedCutoffRadius
          (InversePowerSeries *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  if (piVar1[iVar3] != -1) {
    uVar5 = 0x40280000;
  }
  uVar4 = 0;
  if (piVar1[iVar2] != -1) {
    uVar4 = uVar5;
  }
  return (RealType)((ulong)uVar4 << 0x20);
}

Assistant:

RealType InversePowerSeries::getSuggestedCutoffRadius(
      pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int ipstid1 = InversePowerSeriesTids[atid1];
    int ipstid2 = InversePowerSeriesTids[atid2];

    if (ipstid1 == -1 || ipstid2 == -1)
      return 0.0;
    else {
      // This seems to work moderately well as a default.  There's no
      // inherent scale for 1/r^n interactions that we can standardize.
      // 12 angstroms seems to be a reasonably good guess for most
      // cases.
      return 12.0;
    }
  }